

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O0

size_t sylvan_serialize_assign_rec(BDD bdd)

{
  size_t sVar1;
  int iVar2;
  uint64_t uVar3;
  sylvan_ser *local_38;
  sylvan_ser *ss;
  sylvan_ser s;
  mtbddnode_t n;
  BDD bdd_local;
  
  iVar2 = sylvan_isnode(bdd);
  if (iVar2 == 0) {
    bdd_local = MTBDD_STRIPMARK(bdd);
  }
  else {
    s.assigned = (size_t)MTBDD_GETNODE(bdd);
    ss = (sylvan_ser *)MTBDD_STRIPMARK(bdd);
    local_38 = sylvan_ser_search(sylvan_ser_set,(sylvan_ser *)&ss);
    if (local_38 == (sylvan_ser *)0x0) {
      s.bdd = 0;
      local_38 = sylvan_ser_put(&sylvan_ser_set,(sylvan_ser *)&ss,(int *)0x0);
      uVar3 = mtbddnode_getlow((mtbddnode_t)s.assigned);
      sylvan_serialize_assign_rec(uVar3);
      uVar3 = mtbddnode_gethigh((mtbddnode_t)s.assigned);
      sylvan_serialize_assign_rec(uVar3);
      sVar1 = sylvan_ser_counter + 1;
      local_38->assigned = sylvan_ser_counter;
      sylvan_ser_counter = sVar1;
      sylvan_ser_reversed_insert(&sylvan_ser_reversed_set,local_38);
    }
    bdd_local = local_38->assigned;
  }
  return bdd_local;
}

Assistant:

static size_t
sylvan_serialize_assign_rec(BDD bdd)
{
    if (sylvan_isnode(bdd)) {
        bddnode_t n = MTBDD_GETNODE(bdd);

        struct sylvan_ser s, *ss;
        s.bdd = BDD_STRIPMARK(bdd);
        ss = sylvan_ser_search(sylvan_ser_set, &s);
        if (ss == NULL) {
            // assign dummy value
            s.assigned = 0;
            ss = sylvan_ser_put(&sylvan_ser_set, &s, NULL);

            // first assign recursively
            sylvan_serialize_assign_rec(bddnode_getlow(n));
            sylvan_serialize_assign_rec(bddnode_gethigh(n));

            // assign real value
            ss->assigned = sylvan_ser_counter++;

            // put a copy in the reversed table
            sylvan_ser_reversed_insert(&sylvan_ser_reversed_set, ss);
        }

        return ss->assigned;
    }

    return BDD_STRIPMARK(bdd);
}